

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twentytwenty.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int *piVar5;
  pointer pbVar6;
  char cVar7;
  size_t sVar8;
  ostream *poVar9;
  istream *piVar10;
  int *piVar11;
  long lVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  pointer pbVar23;
  int iVar24;
  int iVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  int *i;
  int *i_1;
  vector<int,_std::allocator<int>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  ifstream file;
  int *local_2b8;
  int *local_2b0;
  int *local_2a8;
  int *local_2a0;
  value_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  char *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  ulong local_248;
  ulong local_240;
  long local_238 [4];
  int aiStack_218 [122];
  
  if (argc == 2) {
    pcVar3 = argv[1];
    sVar8 = strlen(pcVar3);
    std::ifstream::ifstream((istream *)local_238,pcVar3,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      while( true ) {
        cVar7 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_298,cVar7);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_268,&local_298);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_298,
                 (long)local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_270);
      pbVar6 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar23 = local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var18._M_p = local_298._M_dataplus._M_p;
      if (local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        piVar11 = __errno_location();
        do {
          pcVar3 = (pbVar23->_M_dataplus)._M_p;
          iVar16 = *piVar11;
          *piVar11 = 0;
          lVar12 = strtol(pcVar3,&local_270,10);
          if (local_270 == pcVar3) {
            std::__throw_invalid_argument("stoi");
LAB_00102bf5:
            std::__throw_out_of_range("stoi");
LAB_00102c01:
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          if (((int)lVar12 != lVar12) || (*piVar11 == 0x22)) goto LAB_00102bf5;
          if (*piVar11 == 0) {
            *piVar11 = iVar16;
          }
          *(int *)_Var18._M_p = (int)lVar12;
          pbVar23 = pbVar23 + 1;
          _Var18._M_p = _Var18._M_p + 4;
        } while (pbVar23 != pbVar6);
      }
      std::ranges::__sort_fn::
      operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::ranges::less,_std::identity>
                ((__sort_fn *)&std::ranges::sort,local_298._M_dataplus._M_p,
                 local_298._M_string_length);
      if (local_298._M_dataplus._M_p < local_298._M_string_length) {
        piVar17 = (int *)0x0;
        local_2a0 = (int *)0x0;
        piVar11 = (int *)0x0;
        _Var18._M_p = local_298._M_dataplus._M_p;
        do {
          iVar16 = *(int *)_Var18._M_p;
          iVar24 = iVar16 + -0x7e4;
          local_2a8 = piVar11;
          if (iVar24 == 0 || iVar16 < 0x7e4) {
            iVar25 = -iVar24;
            uVar21 = (long)(local_298._M_string_length - (long)_Var18._M_p) >> 2;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var18._M_p;
            while (paVar22 = paVar26, 0 < (long)uVar21) {
              uVar20 = uVar21 >> 1;
              uVar21 = ~uVar20 + uVar21;
              piVar1 = (int *)((long)paVar22 + uVar20 * 4);
              iVar2 = *piVar1;
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(piVar1 + 1);
              if (SBORROW4(iVar2,iVar25) == iVar2 + iVar24 < 0) {
                uVar21 = uVar20;
                paVar26 = paVar22;
              }
            }
            if ((paVar22 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_298._M_string_length) && (*(int *)paVar22 <= iVar25)) {
              if (piVar17 == local_2a0) {
                uVar21 = (long)piVar17 - (long)piVar11;
                if (uVar21 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar19 = (long)uVar21 >> 3;
                uVar20 = uVar19;
                if (piVar17 == piVar11) {
                  uVar20 = 1;
                }
                uVar15 = uVar20 + uVar19;
                if (0xffffffffffffffe < uVar15) {
                  uVar15 = 0xfffffffffffffff;
                }
                if (CARRY8(uVar20,uVar19)) {
                  uVar15 = 0xfffffffffffffff;
                }
                if (uVar15 == 0) {
                  local_2a8 = (int *)0x0;
                }
                else {
                  local_2a8 = (int *)operator_new(uVar15 * 8);
                }
                *(ulong *)(local_2a8 + uVar19 * 2) = CONCAT44(iVar25,iVar16);
                if (0 < (long)uVar21) {
                  memmove(local_2a8,piVar11,uVar21);
                }
                if (piVar11 != (int *)0x0) {
                  operator_delete(piVar11,uVar21);
                }
                piVar17 = (int *)((long)local_2a8 + uVar21 + 8);
                local_2a0 = local_2a8 + uVar15 * 2;
              }
              else {
                *(ulong *)piVar17 = CONCAT44(iVar25,iVar16);
                piVar17 = piVar17 + 2;
              }
            }
          }
          _Var18._M_p = _Var18._M_p + 4;
          piVar11 = local_2a8;
        } while (_Var18._M_p < local_298._M_string_length);
        for (; piVar11 != piVar17; piVar11 = piVar11 + 2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i: ",3);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", j: ",5);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,piVar11[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", i*j: ",7);
          plVar13 = (long *)std::ostream::operator<<(poVar9,piVar11[1] * *piVar11);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          std::ostream::flush();
        }
      }
      else {
        local_2a8 = (int *)0x0;
        local_2a0 = (int *)0x0;
      }
      if (local_298._M_dataplus._M_p < local_298._M_string_length) {
        local_2b0 = (int *)0x0;
        piVar17 = (int *)0x0;
        local_2b8 = (int *)0x0;
        piVar11 = (int *)local_298._M_string_length;
        _Var18._M_p = local_298._M_dataplus._M_p;
        do {
          uVar21 = (long)piVar11 - (long)_Var18._M_p >> 2;
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var18._M_p;
          local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var18._M_p;
          piVar1 = local_2b0;
          paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var18._M_p;
          if (0 < (long)uVar21) {
            do {
              uVar20 = uVar21 >> 1;
              uVar21 = ~uVar20 + uVar21;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar26 + (uVar20 + 1) * 4);
              if (0x7e4 - *(int *)_Var18._M_p < *(int *)((long)paVar14 + -4)) {
                uVar21 = uVar20;
                paVar14 = paVar26;
              }
              paVar26 = paVar14;
            } while (0 < (long)uVar21);
          }
          for (; local_2b0 = piVar1, _Var18._M_p < paVar26; _Var18._M_p = _Var18._M_p + 4) {
            iVar16 = *(int *)paVar22;
            iVar24 = *(int *)_Var18._M_p;
            iVar25 = 0x7e4 - (iVar16 + iVar24);
            if (-1 < iVar25) {
              uVar21 = (long)paVar26 - (long)_Var18._M_p >> 2;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var18._M_p;
              while (paVar4 = paVar14, 0 < (long)uVar21) {
                uVar20 = uVar21 >> 1;
                uVar21 = ~uVar20 + uVar21;
                piVar11 = (int *)((long)paVar4 + uVar20 * 4);
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(piVar11 + 1);
                if (iVar25 <= *piVar11) {
                  uVar21 = uVar20;
                  paVar14 = paVar4;
                }
              }
              if ((paVar4 != paVar26) && (*(int *)paVar4 <= iVar25)) {
                if (piVar17 == local_2b8) {
                  sVar8 = (long)piVar17 - (long)piVar1;
                  if (sVar8 == 0x7ffffffffffffff8) goto LAB_00102c01;
                  uVar20 = ((long)sVar8 >> 2) * -0x5555555555555555;
                  uVar21 = uVar20;
                  if (piVar17 == piVar1) {
                    uVar21 = 1;
                  }
                  local_240 = uVar21 + uVar20;
                  if (0xaaaaaaaaaaaaaa9 < local_240) {
                    local_240 = 0xaaaaaaaaaaaaaaa;
                  }
                  if (CARRY8(uVar21,uVar20)) {
                    local_240 = 0xaaaaaaaaaaaaaaa;
                  }
                  if (local_240 == 0) {
                    local_2b0 = (int *)0x0;
                  }
                  else {
                    local_248 = uVar20;
                    local_2b0 = (int *)operator_new(local_240 * 0xc);
                    uVar20 = local_248;
                    paVar22 = local_278;
                  }
                  local_2b0[uVar20 * 3] = iVar16;
                  local_2b0[uVar20 * 3 + 1] = iVar24;
                  local_2b0[uVar20 * 3 + 2] = iVar25;
                  if (0 < (long)sVar8) {
                    memmove(local_2b0,piVar1,sVar8);
                    paVar22 = local_278;
                  }
                  if (piVar1 != (int *)0x0) {
                    operator_delete(piVar1,sVar8);
                    paVar22 = local_278;
                  }
                  piVar17 = (int *)((long)local_2b0 + sVar8 + 0xc);
                  local_2b8 = local_2b0 + local_240 * 3;
                }
                else {
                  *piVar17 = iVar16;
                  piVar17[1] = iVar24;
                  piVar17[2] = iVar25;
                  piVar17 = piVar17 + 3;
                }
              }
            }
            piVar11 = (int *)local_298._M_string_length;
            piVar1 = local_2b0;
          }
          _Var18._M_p = (pointer)((long)paVar22 + 4);
          piVar5 = piVar1;
        } while (_Var18._M_p < piVar11);
        for (; piVar5 != piVar17; piVar5 = piVar5 + 3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i: ",3);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"j: ",3);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,piVar5[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"k: ",3);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,piVar5[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"i*j*k: ",7);
          plVar13 = (long *)std::ostream::operator<<(poVar9,piVar5[1] * *piVar5 * piVar5[2]);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          std::ostream::flush();
        }
        if (piVar1 != (int *)0x0) {
          operator_delete(piVar1,(long)local_2b8 - (long)piVar1);
        }
      }
      if (local_2a8 != (int *)0x0) {
        operator_delete(local_2a8,(long)local_2a0 - (long)local_2a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) -
                        (long)local_298._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      iVar16 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Could not open ",0xf);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,pcVar3,sVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      iVar16 = 1;
      std::ostream::flush();
    }
    std::ifstream::~ifstream(local_238);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    pcVar3 = *argv;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070a0);
    }
    else {
      sVar8 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," path-to-input",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  namespace ranges = std::ranges;

  constexpr auto twenty20 = 2020;

  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cout << "Could not open " << path << std::endl;
    return 1;
  }

  std::vector<std::string> tokens;
  for (std::string line; std::getline(file, line);)
    tokens.push_back(line);

  std::vector<int> input (tokens.size());
  std::ranges::transform(tokens, input.begin(), [](const auto& line){
    return std::stoi(line);
  });

  ranges::sort(input);

  struct ij { int i, j; };
  std::vector<ij> matching_pairs;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // determine whether `2020-i` is in the input
    auto j = twenty20 - *i;
    if (j >= 0 && std::binary_search(i, input.cend(), j) )
      matching_pairs.emplace_back(ij{*i,j});
  }

  ranges::for_each(matching_pairs, [](const auto& ij){
    auto& [i, j] = ij;
    std::cout << "i: " << i << ", j: " << j << ", i*j: " << i*j << std::endl;
  });

  struct ijk { int i, j, k; };
  std::vector<ijk> matching_triples;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // find the upper bound `ub` s.t. `i+j <= 2020`
    // and for all items `j` in the range `[i,ub]`
    auto ub = std::upper_bound(i, input.cend(), twenty20 - *i);
    for (auto j = i; j < ub; j++) {
      // determine whether 2020-i-j is in the list
      auto k = twenty20 - *i - *j;
      if (k >= 0 && std::binary_search(j, ub, k))
        matching_triples.emplace_back(ijk{*i, *j, k});
    }
  }

  ranges::for_each(matching_triples, [](const auto& ijk){
    auto& [i,j,k] = ijk;
    std::cout <<
              "i: " << i << ", " <<
              "j: " << j << ", " <<
              "k: " << k << ", " <<
              "i*j*k: " << i*j*k << std::endl;
  });

}